

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O2

boolean attack_checks(monst *mtmp,obj *wep,schar dx,schar dy,boolean kicking)

{
  byte *pbVar1;
  boolean bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  obj *poVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  char qbuf [128];
  
  pbVar1 = (byte *)((long)&mtmp->mstrategy + 3);
  *pbVar1 = *pbVar1 & 0xcf;
  if (u.ustuck == mtmp && (u._1052_1_ & 1) != 0) {
    return '\0';
  }
  if (flags.forcefight != '\0') {
    return '\0';
  }
  iVar9 = (int)dx;
  iVar10 = (int)dy;
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0025d1a5;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025d148;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025d13f;
    }
    else {
LAB_0025d13f:
      if (ublindf == (obj *)0x0) goto LAB_0025d1f1;
LAB_0025d148:
      if (ublindf->oartifact != '\x1d') goto LAB_0025d1f1;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_0025d1a5;
LAB_0025d1f1:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
        (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025d23e;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025d239;
      }
      else {
LAB_0025d239:
        if (ublindf != (obj *)0x0) {
LAB_0025d23e:
          if (ublindf->oartifact == '\x1d') goto LAB_0025d2d1;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0025d442;
      }
LAB_0025d2d1:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41))))
      goto LAB_0025d442;
    }
    if ((u.uprops[0x42].intrinsic != 0) ||
       ((((u.uprops[0x42].extrinsic != 0 || (bVar2 = match_warn_of_mon(mtmp), bVar2 != '\0')) ||
         (bVar2 = warning_at(u.ux + iVar9,u.uy + iVar10), bVar2 != '\0')) ||
        ((level->locations[(long)dx + (long)u.ux][(long)dy + (long)u.uy].field_0x6 & 8) != 0))))
    goto LAB_0025d442;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025d39c;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025d397;
LAB_0025d3c2:
      if (((mtmp->field_0x60 & 0x80) != 0) && ((mtmp->data->mflags1 & 0x80) != 0))
      goto LAB_0025d442;
    }
    else {
LAB_0025d397:
      if (ublindf != (obj *)0x0) {
LAB_0025d39c:
        if (ublindf->oartifact == '\x1d') goto LAB_0025d3c2;
      }
    }
    pline("Wait!  There\'s something there you can\'t see!");
    map_invisible(dx + u.ux,dy + u.uy);
    if (((mtmp->m_ap_type != '\0') &&
        (((u.uprops[0x17].intrinsic == 0 && (u.uprops[0x17].extrinsic == 0)) &&
         (u.ustuck == (monst *)0x0)))) &&
       (((mtmp->field_0x62 & 1) == 0 && (bVar2 = dmgtype(mtmp->data,0x13), bVar2 != '\0')))) {
      u.ustuck = mtmp;
    }
    wakeup(mtmp);
LAB_0025ddbf:
    bVar2 = '\x01';
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') goto LAB_0025d1f1;
LAB_0025d1a5:
    uVar5 = *(uint *)&mtmp->field_0x60;
    if ((((uVar5 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_0025d1e3;
      goto LAB_0025d1f1;
    }
    if ((uVar5 & 0x280) != 0) goto LAB_0025d1f1;
LAB_0025d1e3:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_0025d1f1;
LAB_0025d442:
    if (((mtmp->m_ap_type == '\0') || (u.uprops[0x17].intrinsic != 0)) ||
       (u.uprops[0x17].extrinsic != 0)) {
LAB_0025d5b3:
      uVar5 = *(uint *)&mtmp->field_0x60;
      if ((char)uVar5 < '\0') {
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0025d682;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025d623;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025d61a;
          }
          else {
LAB_0025d61a:
            if (ublindf == (obj *)0x0) goto LAB_0025d6c7;
LAB_0025d623:
            if (ublindf->oartifact != '\x1d') goto LAB_0025d6c7;
          }
          if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
              (((youmonst.data)->mflags3 & 0x100) != 0)) &&
             (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))
          goto LAB_0025d682;
        }
        else {
          bVar2 = worm_known(level,mtmp);
          if (bVar2 != '\0') {
            uVar5 = *(uint *)&mtmp->field_0x60;
LAB_0025d682:
            if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar5 & 0x280) == 0) goto LAB_0025d6bd;
            }
            else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0025d6bd:
              if ((u._1052_1_ & 0x20) == 0) goto LAB_0025d6e3;
            }
          }
        }
LAB_0025d6c7:
        bVar2 = warning_at(u.ux + iVar9,u.uy + iVar10);
        if ((bVar2 == '\0') && (((mtmp->data->mflags1 & 0x80) != 0 || (mtmp->data->mlet == '9')))) {
          *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ff7f;
          newsym((int)mtmp->mx,(int)mtmp->my);
          if ((level->locations[mtmp->mx][mtmp->my].field_0x6 & 8) != 0) goto LAB_0025daeb;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025d836;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025d831;
LAB_0025da1c:
            if (u.uprops[0x19].extrinsic != 0) goto LAB_0025da26;
          }
          else {
LAB_0025d831:
            if (ublindf != (obj *)0x0) {
LAB_0025d836:
              if (ublindf->oartifact == '\x1d') goto LAB_0025da1c;
            }
            if (((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                youmonst.data == mons + 0x32) {
LAB_0025da26:
              if (u.uprops[0x19].blocked == 0) goto LAB_0025d6e3;
            }
          }
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025da3d;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025da38;
LAB_0025da8c:
            bVar2 = is_pool(level,(int)mtmp->mx,(int)mtmp->my);
            if ((bVar2 == '\0') || ((u._1052_1_ & 2) != 0)) {
              poVar6 = level->objects[mtmp->mx][mtmp->my];
              if (poVar6 == (obj *)0x0) {
                return '\x01';
              }
              pcVar8 = l_monnam(mtmp);
              pcVar8 = an(pcVar8);
              pcVar7 = doname(poVar6);
              pline("Wait!  There\'s %s hiding under %s!",pcVar8,pcVar7);
              return '\x01';
            }
          }
          else {
LAB_0025da38:
            if (ublindf != (obj *)0x0) {
LAB_0025da3d:
              if (ublindf->oartifact == '\x1d') goto LAB_0025da8c;
            }
          }
          pline("Wait!  There\'s a hidden monster there!");
          goto LAB_0025ddbf;
        }
      }
LAB_0025d6e3:
      if (((mtmp->field_0x60 & 0x80) != 0) || (mtmp->m_ap_type != '\0')) {
        if (((mtmp->data->mflags1 & 0x10000) == 0) &&
           ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
            (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025d74b;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025d746;
LAB_0025d8c8:
            if ((u.uprops[0x19].extrinsic == 0) ||
               ((u.uprops[0x19].blocked != 0 ||
                (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar9))))
            goto LAB_0025d8f7;
          }
          else {
LAB_0025d746:
            if (ublindf != (obj *)0x0) {
LAB_0025d74b:
              if (ublindf->oartifact == '\x1d') goto LAB_0025d8c8;
            }
            if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                 (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                 youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) goto LAB_0025d8c8;
          }
        }
        else {
LAB_0025d8f7:
          if ((u.uprops[0x42].intrinsic == 0) &&
             ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0'))))
          goto LAB_0025d923;
        }
        mtmp->field_0x60 = mtmp->field_0x60 & 0x7f;
        wakeup(mtmp);
      }
LAB_0025d923:
      if (flags.safe_peaceful != 'n') {
        if ((mtmp->field_0x62 & 0x40) == 0) {
          return '\0';
        }
        if (u.uprops[0x1c].intrinsic != 0) {
          return '\0';
        }
        if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
          if (u.uprops[0x1b].intrinsic == 0) goto LAB_0025d9b8;
        }
        else if (u.umonnum != u.umonster) {
          bVar2 = dmgtype(youmonst.data,0x24);
          if (bVar2 == '\0') {
            return '\0';
          }
          if (u.uprops[0x1b].intrinsic != 0) {
            return '\0';
          }
LAB_0025d9b8:
          if ((u.umonnum != 0x9e) && ((youmonst.data)->mlet != '\x1c')) {
            if ((wep == (obj *)0x0) || (wep->oartifact != '\x03')) {
              if (mtmp->wormno == '\0') {
                if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0025dbd9;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025db91;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025db88;
                }
                else {
LAB_0025db88:
                  if (ublindf == (obj *)0x0) goto LAB_0025dc1e;
LAB_0025db91:
                  if (ublindf->oartifact != '\x1d') goto LAB_0025dc1e;
                }
                if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                     (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                    ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) &&
                   ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_0025dbd9;
LAB_0025dc1e:
                if (((mtmp->data->mflags1 & 0x10000) == 0) &&
                   ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
                    (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025dc6b;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025dc66;
                  }
                  else {
LAB_0025dc66:
                    if (ublindf != (obj *)0x0) {
LAB_0025dc6b:
                      if (ublindf->oartifact == '\x1d') goto LAB_0025dce4;
                    }
                    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                    goto LAB_0025dd37;
                  }
LAB_0025dce4:
                  if ((u.uprops[0x19].extrinsic != 0) &&
                     ((u.uprops[0x19].blocked == 0 &&
                      (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar9 < 0x41)
                      ))) goto LAB_0025dd37;
                }
                if ((u.uprops[0x42].intrinsic == 0) &&
                   ((u.uprops[0x42].extrinsic == 0 &&
                    (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) goto LAB_0025d92b;
              }
              else {
                bVar2 = worm_known(level,mtmp);
                if (bVar2 == '\0') goto LAB_0025dc1e;
LAB_0025dbd9:
                uVar5 = *(uint *)&mtmp->field_0x60;
                if ((((uVar5 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                   (u.uprops[0xc].extrinsic == 0)) {
                  if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  goto LAB_0025dc10;
                  goto LAB_0025dc1e;
                }
                if ((uVar5 & 0x280) != 0) goto LAB_0025dc1e;
LAB_0025dc10:
                if ((u._1052_1_ & 0x20) != 0) goto LAB_0025dc1e;
              }
LAB_0025dd37:
              if (flags.safe_peaceful == 'y' && kicking == '\0') {
                pcVar8 = mon_nam(mtmp);
                pline("You stop for %s.",pcVar8);
              }
              else {
                if ((flags.safe_peaceful != 'a') && (kicking == '\0' || flags.safe_peaceful != 'y'))
                goto LAB_0025d92b;
                pcVar8 = mon_nam(mtmp);
                sprintf(qbuf,"Really attack %s?",pcVar8);
                cVar3 = paranoid_yn(qbuf,iflags.paranoid_hit);
                if (cVar3 == 'y') {
                  return '\0';
                }
              }
              flags.move = '\0';
              goto LAB_0025ddbf;
            }
            override_confirmation = 1;
          }
        }
      }
    }
    else {
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
          (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025d4b5;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025d4b0;
        }
        else {
LAB_0025d4b0:
          if (ublindf != (obj *)0x0) {
LAB_0025d4b5:
            if (ublindf->oartifact == '\x1d') goto LAB_0025d548;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0025d5b3;
        }
LAB_0025d548:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41))))
        goto LAB_0025d5b3;
      }
      if ((u.uprops[0x42].intrinsic != 0) ||
         (((u.uprops[0x42].extrinsic != 0 || (bVar2 = match_warn_of_mon(mtmp), bVar2 != '\0')) ||
          (bVar2 = warning_at(u.ux + iVar9,u.uy + iVar10), bVar2 != '\0')))) goto LAB_0025d5b3;
      if ((level->locations[mtmp->mx][mtmp->my].field_0x6 & 8) == 0) {
        stumble_onto_mimic(mtmp,dx,dy);
        goto LAB_0025ddbf;
      }
LAB_0025daeb:
      seemimic(mtmp);
    }
LAB_0025d92b:
    bVar2 = '\0';
  }
  return bVar2;
}

Assistant:

boolean attack_checks(struct monst *mtmp,
		      struct obj *wep,/* uwep for attack(), null for kick_monster() */
		      schar dx, schar dy,
		      boolean kicking)
{
	char qbuf[QBUFSZ];

	/* if you're close enough to attack, alert any waiting monster */
	mtmp->mstrategy &= ~STRAT_WAITMASK;

	if (u.uswallow && mtmp == u.ustuck) return FALSE;

	if (flags.forcefight) {
		/* Do this in the caller, after we checked that the monster
		 * didn't die from the blow.  Reason: putting the 'I' there
		 * causes the hero to forget the square's contents since
		 * both 'I' and remembered contents are stored in .glyph.
		 * If the monster dies immediately from the blow, the 'I' will
		 * not stay there, so the player will have suddenly forgotten
		 * the square's contents for no apparent reason.
		if (!canspotmon(mtmp) &&
		    !level->locations[u.ux+u.dx][u.uy+u.dy].mem_invis)
			map_invisible(u.ux+u.dx, u.uy+u.dy);
		 */
		return FALSE;
	}

	/* Put up an invisible monster marker, but with exceptions for
	 * monsters that hide and monsters you've been warned about.
	 * The former already prints a warning message and
	 * prevents you from hitting the monster just via the hidden monster
	 * code below; if we also did that here, similar behavior would be
	 * happening two turns in a row.  The latter shows a glyph on
	 * the screen, so you know something is there.
	 */
	if (!canspotmon(level, mtmp) &&
		    !warning_at(u.ux+dx, u.uy+dy) &&
		    !level->locations[u.ux+dx][u.uy+dy].mem_invis &&
		    !(!Blind && mtmp->mundetected && hides_under(mtmp->data))) {
		pline("Wait!  There's something there you can't see!");
		map_invisible(u.ux+dx, u.uy+dy);
		/* if it was an invisible mimic, treat it as if we stumbled
		 * onto a visible mimic
		 */
		if (mtmp->m_ap_type && !Protection_from_shape_changers) {
		    if (!u.ustuck && !mtmp->mflee && dmgtype(mtmp->data,AD_STCK))
			u.ustuck = mtmp;
		}
		wakeup(mtmp); /* always necessary; also un-mimics mimics */
		return TRUE;
	}

	if (mtmp->m_ap_type && !Protection_from_shape_changers &&
	   !sensemon(mtmp) &&
	   !warning_at(u.ux+dx, u.uy+dy)) {
		/* If a hidden mimic was in a square where a player remembers
		 * some (probably different) unseen monster, the player is in
		 * luck--he attacks it even though it's hidden.
		 */
		if (level->locations[mtmp->mx][mtmp->my].mem_invis) {
		    seemimic(mtmp);
		    return FALSE;
		}
		stumble_onto_mimic(mtmp, dx, dy);
		return TRUE;
	}

	if (mtmp->mundetected && !canseemon(level, mtmp) &&
		!warning_at(u.ux+dx, u.uy+dy) &&
		(hides_under(mtmp->data) || mtmp->data->mlet == S_EEL)) {
	    mtmp->mundetected = mtmp->msleeping = 0;
	    newsym(mtmp->mx, mtmp->my);
	    if (level->locations[mtmp->mx][mtmp->my].mem_invis) {
		seemimic(mtmp);
		return FALSE;
	    }
	    if (!(Blind ? Blind_telepat : Unblind_telepat)) {
		struct obj *obj;

		if (Blind || (is_pool(level, mtmp->mx,mtmp->my) && !Underwater))
		    pline("Wait!  There's a hidden monster there!");
		else if ((obj = level->objects[mtmp->mx][mtmp->my]) != 0)
		    pline("Wait!  There's %s hiding under %s!",
			  an(l_monnam(mtmp)), doname(obj));
		return TRUE;
	    }
	}

	/*
	 * make sure to wake up a monster from the above cases if the
	 * hero can sense that the monster is there.
	 */
	if ((mtmp->mundetected || mtmp->m_ap_type) && sensemon(mtmp)) {
	    mtmp->mundetected = 0;
	    wakeup(mtmp);
	}

	if (flags.safe_peaceful != 'n' && mtmp->mpeaceful
	    && !Confusion && !Hallucination && !Stunned) {
		/* Intelligent chaotic weapons (Stormbringer) want blood */
		if (wep && wep->oartifact == ART_STORMBRINGER) {
			override_confirmation = TRUE;
			return FALSE;
		}
		if (canspotmon(level, mtmp)) {
			boolean call_off_harm = FALSE;
			if (flags.safe_peaceful == 'y' && !kicking) {
				pline("You stop for %s.", mon_nam(mtmp));
				call_off_harm = TRUE;
			} else if (flags.safe_peaceful == 'a' ||
				   (flags.safe_peaceful == 'y' && kicking)) {
				sprintf(qbuf, "Really attack %s?", mon_nam(mtmp));
				if (paranoid_yn(qbuf, iflags.paranoid_hit) != 'y')
					call_off_harm = TRUE;
			}
			if (call_off_harm) {
				flags.move = 0;
				return TRUE;
			}
		}
	}

	return FALSE;
}